

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxbp.cpp
# Opt level: O0

void __thiscall libDAI::BoxBP::run(BoxBP *this,FactorGraph *fg,size_t maxiter)

{
  VarSet *pVVar1;
  edge_type *peVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  size_t sVar4;
  ulong in_RDX;
  long *in_RSI;
  Box *in_RDI;
  size_t t;
  size_t iter;
  size_t e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  size_t i;
  size_t iI;
  value_type *in_stack_fffffffffffffed8;
  FactorGraph *in_stack_fffffffffffffee0;
  ulong uVar5;
  Var *in_stack_fffffffffffffee8;
  VarSet *in_stack_fffffffffffffef0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  Box *in_stack_ffffffffffffff08;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  VarSet *ns;
  ulong local_d8;
  ulong local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98 [4];
  unsigned_long local_28;
  VarSet *local_20;
  ulong local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::clear
            ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)0xb14f11);
  FactorGraph::nrEdges((FactorGraph *)0xb14f1e);
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::reserve
            ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)in_RDI,in_stack_ffffffffffffff18);
  local_20 = (VarSet *)0x0;
  while( true ) {
    ns = local_20;
    pVVar1 = (VarSet *)FactorGraph::nrEdges((FactorGraph *)0xb14f51);
    if (pVVar1 <= ns) break;
    in_stack_ffffffffffffff08 = in_RDI;
    peVar2 = FactorGraph::edge(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    local_28 = peVar2->first;
    in_RDI = in_stack_ffffffffffffff08;
    (**(code **)(*local_10 + 0x30))(local_10,local_28);
    in_stack_ffffffffffffff10 = local_98;
    VarSet::VarSet(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    Box::Box(in_RDI,ns);
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::push_back
              ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    Box::~Box((Box *)in_stack_fffffffffffffee0);
    VarSet::~VarSet((VarSet *)0xb14fff);
    local_20 = (VarSet *)
               ((long)&(local_20->_vars).
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xb1506b);
  FactorGraph::nrEdges((FactorGraph *)0xb15078);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
  local_c8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    this_00 = local_c8;
    pvVar3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             FactorGraph::nrEdges((FactorGraph *)0xb150b0);
    if (pvVar3 <= this_00) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (this_00,(value_type_conflict2 *)in_stack_fffffffffffffee8);
    local_c8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  for (local_d0 = 0; local_d0 < local_18; local_d0 = local_d0 + 1) {
    local_d8 = 0;
    while( true ) {
      uVar5 = local_d8;
      sVar4 = FactorGraph::nrEdges((FactorGraph *)0xb15144);
      if (sVar4 <= uVar5) break;
      calcNewBox((BoxBP *)maxiter,(FactorGraph *)iI,i);
      local_d8 = local_d8 + 1;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
  return;
}

Assistant:

void BoxBP::run( const FactorGraph &fg, size_t maxiter ) {
        _boxes.clear();
        _boxes.reserve( fg.nrEdges() );
        for( size_t iI = 0; iI < fg.nrEdges(); iI++ ) {
            size_t i = fg.edge(iI).first;
            _boxes.push_back( Box( fg.var(i) ) );
        }
        
        vector<size_t> edge_seq;
        edge_seq.reserve( fg.nrEdges() );
        for( size_t e = 0; e < fg.nrEdges(); e++ )
            edge_seq.push_back( e );

        for( size_t iter = 0; iter < maxiter; iter++ ) {
            for( size_t t = 0; t < fg.nrEdges(); t++ )
                calcNewBox(fg, t);
        }
    }